

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O2

void ImportOneRow(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int rgb_step,int rgb_bit_depth,
                 int pic_width,fixed_y_t *dst)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  long lVar9;
  
  iVar3 = rgb_step / 2;
  if (rgb_bit_depth < 9) {
    iVar3 = rgb_step;
  }
  uVar8 = pic_width + 1U & 0xfffffffe;
  iVar1 = 0xe - rgb_bit_depth;
  if (rgb_bit_depth < 0xd) {
    iVar1 = 2;
  }
  bVar2 = (byte)iVar1;
  bVar5 = -bVar2;
  lVar4 = (long)pic_width;
  lVar6 = 0;
  lVar9 = 0;
  do {
    if (rgb_bit_depth == 8) {
      dst[lVar9] = (ushort)r_ptr[lVar6] << 2;
      dst[(int)uVar8 + lVar9] = (ushort)g_ptr[lVar6] << 2;
      uVar7 = (ushort)b_ptr[lVar6] << 2;
    }
    else {
      uVar7 = *(ushort *)(r_ptr + lVar6 * 2) >> (bVar5 & 0x1f);
      if (-1 < iVar1) {
        uVar7 = *(ushort *)(r_ptr + lVar6 * 2) << (bVar2 & 0x1f);
      }
      dst[lVar9] = uVar7;
      uVar7 = *(ushort *)(g_ptr + lVar6 * 2) >> (bVar5 & 0x1f);
      if (-1 < iVar1) {
        uVar7 = *(ushort *)(g_ptr + lVar6 * 2) << (bVar2 & 0x1f);
      }
      dst[(int)uVar8 + lVar9] = uVar7;
      uVar7 = *(ushort *)(b_ptr + lVar6 * 2) >> (bVar5 & 0x1f);
      if (-1 < iVar1) {
        uVar7 = *(ushort *)(b_ptr + lVar6 * 2) << (bVar2 & 0x1f);
      }
    }
    dst[(int)(uVar8 * 2) + lVar9] = uVar7;
    lVar9 = lVar9 + 1;
    lVar6 = lVar6 + iVar3;
  } while (lVar9 < lVar4);
  if ((pic_width & 1U) != 0) {
    dst[lVar4] = dst[lVar4 + -1];
    dst[(int)(uVar8 + pic_width)] = dst[(long)(int)(uVar8 + pic_width) + -1];
    lVar4 = (long)(int)(pic_width + (pic_width + 1U) * 2);
    dst[lVar4] = dst[lVar4 + -1];
  }
  return;
}

Assistant:

static void ImportOneRow(const uint8_t* const r_ptr,
                         const uint8_t* const g_ptr,
                         const uint8_t* const b_ptr,
                         int rgb_step,
                         int rgb_bit_depth,
                         int pic_width,
                         fixed_y_t* const dst) {
  // Convert the rgb_step from a number of bytes to a number of uint8_t or
  // uint16_t values depending the bit depth.
  const int step = (rgb_bit_depth > 8) ? rgb_step / 2 : rgb_step;
  int i = 0;
  const int w = (pic_width + 1) & ~1;
  do {
    const int off = i * step;
    const int shift = GetPrecisionShift(rgb_bit_depth);
    if (rgb_bit_depth == 8) {
      dst[i + 0 * w] = Shift(r_ptr[off], shift);
      dst[i + 1 * w] = Shift(g_ptr[off], shift);
      dst[i + 2 * w] = Shift(b_ptr[off], shift);
    } else {
      dst[i + 0 * w] = Shift(((uint16_t*)r_ptr)[off], shift);
      dst[i + 1 * w] = Shift(((uint16_t*)g_ptr)[off], shift);
      dst[i + 2 * w] = Shift(((uint16_t*)b_ptr)[off], shift);
    }
  } while (++i < pic_width);
  if (pic_width & 1) {  // replicate rightmost pixel
    dst[pic_width + 0 * w] = dst[pic_width + 0 * w - 1];
    dst[pic_width + 1 * w] = dst[pic_width + 1 * w - 1];
    dst[pic_width + 2 * w] = dst[pic_width + 2 * w - 1];
  }
}